

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv__fs_opendir(uv_fs_t *req)

{
  void *ptr;
  DIR *pDVar1;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  ptr = uv__malloc(0x38);
  if (ptr != (void *)0x0) {
    pDVar1 = opendir(req->path);
    *(DIR **)((long)ptr + 0x30) = pDVar1;
    if (*(long *)((long)ptr + 0x30) != 0) {
      req->ptr = ptr;
      return 0;
    }
  }
  uv__free(ptr);
  req->ptr = (void *)0x0;
  return -1;
}

Assistant:

static int uv__fs_opendir(uv_fs_t* req) {
  uv_dir_t* dir;

  dir = uv__malloc(sizeof(*dir));
  if (dir == NULL)
    goto error;

  dir->dir = opendir(req->path);
  if (dir->dir == NULL)
    goto error;

  req->ptr = dir;
  return 0;

error:
  uv__free(dir);
  req->ptr = NULL;
  return -1;
}